

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_common.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::~FieldGeneratorMap
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  ppIVar2 = (this->field_generators_).
            super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (this->field_generators_).
            super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar2 != ppIVar1) {
    do {
      if (*ppIVar2 != (ImmutableFieldGenerator *)0x0) {
        (*((*ppIVar2)->super_FieldGenerator)._vptr_FieldGenerator[1])();
      }
      ppIVar2 = ppIVar2 + 1;
    } while (ppIVar2 != ppIVar1);
    ppIVar2 = (this->field_generators_).
              super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppIVar2 != (pointer)0x0) {
    operator_delete(ppIVar2,(long)(this->field_generators_).
                                  super__Vector_base<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::allocator<const_google::protobuf::compiler::java::ImmutableFieldGenerator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar2
                   );
    return;
  }
  return;
}

Assistant:

~FieldGeneratorMap() {
    for (const auto* g : field_generators_) {
      delete g;
    }
  }